

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

ClockingBlockSymbol *
slang::ast::ClockingBlockSymbol::fromSyntax(Scope *scope,ClockingDeclarationSyntax *syntax)

{
  TokenKind TVar1;
  Compilation *args;
  size_t sVar2;
  SyntaxNode *syntax_00;
  long lVar3;
  ClockingSkewSyntax *this;
  ClockingBlockSymbol *clocking;
  Diagnostic *pDVar4;
  SourceLocation SVar5;
  ClockingSkewSyntax *pCVar6;
  ClockingSkewSyntax *pCVar7;
  ClockingSkewSyntax *this_00;
  ClockingSkewSyntax *pCVar8;
  pointer ppMVar9;
  long lVar10;
  SourceRange SVar11;
  Token local_60;
  pointer local_50;
  ClockingBlockSymbol *local_48;
  Scope *local_40;
  SourceLocation local_38;
  
  args = scope->compilation;
  local_60 = (Token)parsing::Token::valueText(&syntax->blockName);
  local_38 = parsing::Token::location(&syntax->blockName);
  clocking = BumpAllocator::
             emplace<slang::ast::ClockingBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&args->super_BumpAllocator,args,
                        (basic_string_view<char,_std::char_traits<char>_> *)&local_60,&local_38);
  (clocking->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  TVar1 = (syntax->globalOrDefault).kind;
  if (TVar1 == GlobalKeyword) {
    SVar11 = parsing::Token::range(&syntax->clocking);
    Compilation::noteGlobalClocking(args,scope,&clocking->super_Symbol,SVar11);
    if (scope->thisSym->kind == GenerateBlock) {
      SVar11 = parsing::Token::range(&syntax->clocking);
      Scope::addDiag(scope,(DiagCode)0x3f0006,SVar11);
    }
  }
  else if (TVar1 == DefaultKeyword) {
    SVar11 = parsing::Token::range(&syntax->clocking);
    Compilation::noteDefaultClocking(args,scope,&clocking->super_Symbol,SVar11);
  }
  sVar2 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  local_48 = clocking;
  if (sVar2 == 0) {
    pCVar8 = (ClockingSkewSyntax *)0x0;
    pCVar7 = (ClockingSkewSyntax *)0x0;
  }
  else {
    ppMVar9 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    local_40 = &clocking->super_Scope;
    lVar10 = 0;
    pCVar6 = (ClockingSkewSyntax *)0x0;
    this_00 = (ClockingSkewSyntax *)0x0;
    local_50 = ppMVar9;
    do {
      syntax_00 = *(SyntaxNode **)((long)ppMVar9 + lVar10);
      pCVar7 = pCVar6;
      pCVar8 = this_00;
      if (syntax_00->kind == DefaultSkewItem) {
        lVar3 = *(long *)(syntax_00 + 4);
        this = *(ClockingSkewSyntax **)(lVar3 + 0x28);
        if ((this != (ClockingSkewSyntax *)0x0) &&
           (pCVar7 = this, pCVar6 != (ClockingSkewSyntax *)0x0)) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
          pDVar4 = Scope::addDiag(scope,(DiagCode)0x840006,SVar11);
          local_60 = slang::syntax::SyntaxNode::getFirstToken(&pCVar6->super_SyntaxNode);
          SVar5 = parsing::Token::location(&local_60);
          ppMVar9 = local_50;
          Diagnostic::addNote(pDVar4,(DiagCode)0xa0001,SVar5);
          pCVar7 = pCVar6;
        }
        pCVar6 = *(ClockingSkewSyntax **)(lVar3 + 0x40);
        if ((pCVar6 != (ClockingSkewSyntax *)0x0) &&
           (pCVar8 = pCVar6, this_00 != (ClockingSkewSyntax *)0x0)) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(&pCVar6->super_SyntaxNode);
          pDVar4 = Scope::addDiag(scope,(DiagCode)0x850006,SVar11);
          local_60 = slang::syntax::SyntaxNode::getFirstToken(&this_00->super_SyntaxNode);
          SVar5 = parsing::Token::location(&local_60);
          ppMVar9 = local_50;
          Diagnostic::addNote(pDVar4,(DiagCode)0xa0001,SVar5);
          pCVar8 = this_00;
        }
      }
      else {
        Scope::addMembers(local_40,syntax_00);
      }
      lVar10 = lVar10 + 8;
      pCVar6 = pCVar7;
      this_00 = pCVar8;
    } while (sVar2 << 3 != lVar10);
  }
  local_48->inputSkewSyntax = pCVar7;
  local_48->outputSkewSyntax = pCVar8;
  return local_48;
}

Assistant:

ClockingBlockSymbol& ClockingBlockSymbol::fromSyntax(const Scope& scope,
                                                     const ClockingDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ClockingBlockSymbol>(comp, syntax.blockName.valueText(),
                                                    syntax.blockName.location());
    result->setSyntax(syntax);

    if (syntax.globalOrDefault.kind == TokenKind::DefaultKeyword)
        comp.noteDefaultClocking(scope, *result, syntax.clocking.range());
    else if (syntax.globalOrDefault.kind == TokenKind::GlobalKeyword) {
        comp.noteGlobalClocking(scope, *result, syntax.clocking.range());
        if (scope.asSymbol().kind == SymbolKind::GenerateBlock)
            scope.addDiag(diag::GlobalClockingGenerate, syntax.clocking.range());
    }

    const ClockingSkewSyntax* inputSkew = nullptr;
    const ClockingSkewSyntax* outputSkew = nullptr;

    for (auto item : syntax.items) {
        if (item->kind == SyntaxKind::DefaultSkewItem) {
            auto& dir = *item->as<DefaultSkewItemSyntax>().direction;
            if (dir.inputSkew) {
                if (inputSkew) {
                    auto& diag = scope.addDiag(diag::MultipleDefaultInputSkew,
                                               dir.inputSkew->sourceRange());
                    diag.addNote(diag::NotePreviousDefinition,
                                 inputSkew->getFirstToken().location());
                }
                else {
                    inputSkew = dir.inputSkew;
                }
            }

            if (dir.outputSkew) {
                if (outputSkew) {
                    auto& diag = scope.addDiag(diag::MultipleDefaultOutputSkew,
                                               dir.outputSkew->sourceRange());
                    diag.addNote(diag::NotePreviousDefinition,
                                 outputSkew->getFirstToken().location());
                }
                else {
                    outputSkew = dir.outputSkew;
                }
            }
        }
        else {
            result->addMembers(*item);
        }
    }

    result->inputSkewSyntax = inputSkew;
    result->outputSkewSyntax = outputSkew;

    return *result;
}